

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icosahedron.h
# Opt level: O3

void icosahedron<Eigen::Matrix<float,_1,3,1,_1,3>,Eigen::Matrix<unsigned_int,_1,3,1,_1,3>>
               (PlainObjectBase<Eigen::Matrix<float,__1,_3,_1,__1,_3>_> *V,
               PlainObjectBase<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_> *F)

{
  Matrix<float,__1,_3,_1,__1,_3> *pMVar1;
  float *pfVar2;
  float *pfVar3;
  Matrix<unsigned_int,__1,_3,_1,__1,_3> *pMVar4;
  uint *puVar5;
  uint *puVar6;
  ulong uVar7;
  undefined8 uVar8;
  CommaInitializer<Eigen::Matrix<float,__1,_3,_1,__1,_3>_> *pCVar9;
  CommaInitializer<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_> *pCVar10;
  undefined8 *puVar11;
  Index index;
  ulong uVar12;
  char *pcVar13;
  long lVar14;
  long lVar15;
  PlainObjectBase<Eigen::Matrix<float,__1,_3,_1,__1,_3>_> local_148;
  Scalar local_12c;
  Scalar local_128;
  Scalar local_124;
  Scalar local_120;
  Scalar local_11c;
  Scalar local_118;
  Scalar local_114;
  Scalar local_110;
  Scalar local_10c;
  Scalar local_108;
  Scalar local_104;
  Scalar local_100;
  Scalar local_fc;
  Scalar local_f8;
  Scalar local_f4;
  Scalar local_f0;
  Scalar local_ec;
  Scalar local_e8;
  Scalar local_e4;
  Scalar local_e0;
  Scalar local_dc;
  Scalar local_d8;
  Scalar local_d4;
  Scalar local_d0;
  Scalar local_cc;
  Scalar local_c8;
  Scalar local_c4;
  Scalar local_c0;
  Scalar local_bc;
  Scalar local_b8;
  Scalar local_b4;
  Scalar local_b0;
  Scalar local_ac;
  Scalar local_a8;
  Scalar local_a4;
  CommaInitializer<Eigen::Matrix<float,__1,_3,_1,__1,_3>_> local_a0;
  Scalar local_80 [24];
  
  local_148.m_storage.m_data = (float *)0x0;
  local_148.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::resize(&local_148,0xc,3);
  local_a0.m_row = 0;
  local_a0.m_col = 1;
  local_a0.m_currentBlockRows = 1;
  *local_148.m_storage.m_data = 0.0;
  local_a4 = 0.0;
  local_a0.m_xpr = (Matrix<float,__1,_3,_1,__1,_3> *)&local_148;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (&local_a0,&local_a4);
  local_a8 = 1.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_a8);
  local_ac = 0.7236068;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_ac);
  local_b0 = -0.5257311;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_b0);
  local_b4 = 0.4472136;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_b4);
  local_b8 = 0.7236068;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_b8);
  local_bc = 0.5257311;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_bc);
  local_c0 = 0.4472136;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_c0);
  local_c4 = -0.2763932;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_c4);
  local_c8 = 0.8506508;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_c8);
  local_cc = 0.4472136;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_cc);
  local_d0 = -0.8944272;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_d0);
  local_d4 = 1.0953574e-16;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_d4);
  local_d8 = 0.4472136;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_d8);
  local_dc = -0.2763932;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_dc);
  local_e0 = -0.8506508;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_e0);
  local_e4 = 0.4472136;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_e4);
  local_e8 = 0.8944272;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_e8);
  local_ec = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_ec);
  local_f0 = -0.4472136;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_f0);
  local_f4 = 0.2763932;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_f4);
  local_f8 = 0.8506508;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_f8);
  local_fc = -0.4472136;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_fc);
  local_100 = -0.7236068;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_100);
  local_104 = 0.5257311;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_104);
  local_108 = -0.4472136;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_108);
  local_10c = -0.7236068;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_10c);
  local_110 = -0.5257311;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_110);
  local_114 = -0.4472136;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_114);
  local_118 = 0.2763932;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_118);
  local_11c = -0.8506508;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_11c);
  local_120 = -0.4472136;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_120);
  local_124 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_124);
  local_128 = 0.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_128);
  local_12c = -1.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar9,&local_12c);
  lVar15 = pCVar9->m_currentBlockRows + pCVar9->m_row;
  pMVar1 = pCVar9->m_xpr;
  if ((lVar15 == (pMVar1->super_PlainObjectBase<Eigen::Matrix<float,__1,_3,_1,__1,_3>_>).m_storage.
                 m_rows) && (pCVar9->m_col == 3)) {
    if (0x2aaaaaaaaaaaaaaa < lVar15) {
      puVar11 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar11 = XDestroyIC;
      __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::resize(V,lVar15,3);
    lVar15 = (V->m_storage).m_rows;
    if (lVar15 != (pMVar1->super_PlainObjectBase<Eigen::Matrix<float,__1,_3,_1,__1,_3>_>).m_storage.
                  m_rows) {
      pcVar13 = 
      "Derived &Eigen::DenseBase<Eigen::Matrix<float, -1, 3, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<float, -1, 3, 1>, OtherDerived = Eigen::Matrix<float, -1, 3, 1>]"
      ;
LAB_00121b47:
      __assert_fail("rows() == other.rows() && cols() == other.cols()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dilevin[P]computer-graphics-shader-pipeline/eigen/Eigen/src/Core/Assign.h"
                    ,0x1f9,pcVar13);
    }
    uVar7 = lVar15 * 3;
    uVar12 = lVar15 * 3 + 3;
    if (-1 < (long)uVar7) {
      uVar12 = uVar7;
    }
    uVar12 = uVar12 & 0xfffffffffffffffc;
    if (1 < lVar15) {
      lVar14 = 0;
      do {
        pfVar2 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<float,__1,_3,_1,__1,_3>_>).m_storage.
                 m_data + lVar14;
        uVar8 = *(undefined8 *)(pfVar2 + 2);
        pfVar3 = (V->m_storage).m_data + lVar14;
        *(undefined8 *)pfVar3 = *(undefined8 *)pfVar2;
        *(undefined8 *)(pfVar3 + 2) = uVar8;
        lVar14 = lVar14 + 4;
      } while (lVar14 < (long)uVar12);
    }
    if (SBORROW8(uVar12,uVar7) != (long)(uVar12 + lVar15 * -3) < 0) {
      pfVar2 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<float,__1,_3,_1,__1,_3>_>).m_storage.
               m_data;
      pfVar3 = (V->m_storage).m_data;
      do {
        pfVar3[uVar12] = pfVar2[uVar12];
        uVar12 = uVar12 + 1;
      } while (uVar7 != uVar12);
    }
    if ((local_a0.m_currentBlockRows + local_a0.m_row ==
         ((local_a0.m_xpr)->super_PlainObjectBase<Eigen::Matrix<float,__1,_3,_1,__1,_3>_>).m_storage
         .m_rows) && (local_a0.m_col == 3)) {
      free(local_148.m_storage.m_data);
      local_148.m_storage.m_data = (float *)0x0;
      local_148.m_storage.m_rows = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::resize
                ((PlainObjectBase<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_> *)&local_148,0x14,3
                );
      local_a0.m_row = 0;
      local_a0.m_col = 1;
      local_a0.m_currentBlockRows = 1;
      *local_148.m_storage.m_data = 0.0;
      local_a4 = 1.4013e-45;
      local_a0.m_xpr = (Matrix<float,__1,_3,_1,__1,_3> *)&local_148;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          ((CommaInitializer<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_> *)
                           &local_a0,(Scalar *)&local_a4);
      local_a8 = 2.8026e-45;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_a8);
      local_ac = 0.0;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_ac);
      local_b0 = 2.8026e-45;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_b0);
      local_b4 = 4.2039e-45;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_b4);
      local_b8 = 0.0;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_b8);
      local_bc = 4.2039e-45;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_bc);
      local_c0 = 5.60519e-45;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_c0);
      local_c4 = 0.0;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_c4);
      local_c8 = 5.60519e-45;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_c8);
      local_cc = 7.00649e-45;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_cc);
      local_d0 = 0.0;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_d0);
      local_d4 = 7.00649e-45;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_d4);
      local_d8 = 1.4013e-45;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_d8);
      local_dc = 1.4013e-45;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_dc);
      local_e0 = 8.40779e-45;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_e0);
      local_e4 = 2.8026e-45;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_e4);
      local_e8 = 2.8026e-45;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_e8);
      local_ec = 9.80909e-45;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_ec);
      local_f0 = 4.2039e-45;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_f0);
      local_f4 = 4.2039e-45;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_f4);
      local_f8 = 1.12104e-44;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_f8);
      local_fc = 5.60519e-45;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_fc);
      local_100 = 5.60519e-45;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_100);
      local_104 = 1.26117e-44;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_104);
      local_108 = 7.00649e-45;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_108);
      local_10c = 7.00649e-45;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_10c);
      local_110 = 1.4013e-44;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_110);
      local_114 = 1.4013e-45;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_114);
      local_118 = 8.40779e-45;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_118);
      local_11c = 9.80909e-45;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_11c);
      local_120 = 2.8026e-45;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_120);
      local_124 = 9.80909e-45;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_124);
      local_128 = 1.12104e-44;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_128);
      local_12c = 4.2039e-45;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,(Scalar *)&local_12c);
      local_80[0x17] = 8;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,local_80 + 0x17);
      local_80[0x16] = 9;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,local_80 + 0x16);
      local_80[0x15] = 4;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,local_80 + 0x15);
      local_80[0x14] = 9;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,local_80 + 0x14);
      local_80[0x13] = 10;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,local_80 + 0x13);
      local_80[0x12] = 5;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,local_80 + 0x12);
      local_80[0x11] = 10;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,local_80 + 0x11);
      local_80[0x10] = 6;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,local_80 + 0x10);
      local_80[0xf] = 1;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,local_80 + 0xf);
      local_80[0xe] = 6;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,local_80 + 0xe);
      local_80[0xd] = 0xb;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,local_80 + 0xd);
      local_80[0xc] = 7;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,local_80 + 0xc);
      local_80[0xb] = 7;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,local_80 + 0xb);
      local_80[10] = 0xb;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,local_80 + 10);
      local_80[9] = 8;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,local_80 + 9);
      local_80[8] = 8;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,local_80 + 8);
      local_80[7] = 0xb;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,local_80 + 7);
      local_80[6] = 9;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,local_80 + 6);
      local_80[5] = 9;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,local_80 + 5);
      local_80[4] = 0xb;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,local_80 + 4);
      local_80[3] = 10;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,local_80 + 3);
      local_80[2] = 10;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,local_80 + 2);
      local_80[1] = 0xb;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,local_80 + 1);
      local_80[0] = 6;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                          (pCVar10,local_80);
      lVar15 = pCVar10->m_currentBlockRows + pCVar10->m_row;
      pMVar4 = pCVar10->m_xpr;
      if ((lVar15 == (pMVar4->super_PlainObjectBase<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_>).
                     m_storage.m_rows) && (pCVar10->m_col == 3)) {
        if (0x2aaaaaaaaaaaaaaa < lVar15) {
          puVar11 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar11 = XDestroyIC;
          __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        Eigen::PlainObjectBase<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::resize(F,lVar15,3);
        lVar15 = (F->m_storage).m_rows;
        if (lVar15 != (pMVar4->super_PlainObjectBase<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_>)
                      .m_storage.m_rows) {
          pcVar13 = 
          "Derived &Eigen::DenseBase<Eigen::Matrix<unsigned int, -1, 3, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<unsigned int, -1, 3, 1>, OtherDerived = Eigen::Matrix<unsigned int, -1, 3, 1>]"
          ;
          goto LAB_00121b47;
        }
        if (0 < lVar15) {
          puVar5 = (pMVar4->super_PlainObjectBase<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_>).
                   m_storage.m_data;
          puVar6 = (F->m_storage).m_data;
          lVar14 = 1;
          if (1 < lVar15 * 3) {
            lVar14 = lVar15 * 3;
          }
          lVar15 = 0;
          do {
            puVar6[lVar15] = puVar5[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar14 != lVar15);
        }
        if ((local_a0.m_currentBlockRows + local_a0.m_row ==
             ((local_a0.m_xpr)->super_PlainObjectBase<Eigen::Matrix<float,__1,_3,_1,__1,_3>_>).
             m_storage.m_rows) && (local_a0.m_col == 3)) {
          free(local_148.m_storage.m_data);
          return;
        }
      }
      pcVar13 = 
      "XprType &Eigen::CommaInitializer<Eigen::Matrix<unsigned int, -1, 3, 1>>::finished() [MatrixType = Eigen::Matrix<unsigned int, -1, 3, 1>]"
      ;
      goto LAB_00121ab5;
    }
  }
  pcVar13 = 
  "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, -1, 3, 1>>::finished() [MatrixType = Eigen::Matrix<float, -1, 3, 1>]"
  ;
LAB_00121ab5:
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/dilevin[P]computer-graphics-shader-pipeline/eigen/Eigen/src/Core/CommaInitializer.h"
                ,0x6f,pcVar13);
}

Assistant:

inline void icosahedron(
  Eigen::PlainObjectBase<DerivedV> & V,
  Eigen::PlainObjectBase<DerivedF> & F)
{
  V = (DerivedV(12,3) <<
    0,0,1,
    0.72360679774997894,-0.52573111211913359,0.44721359549995793,
    0.72360679774997894,0.52573111211913359,0.44721359549995793,
    -0.27639320225002095,0.85065080835203999,0.44721359549995793,
    -0.89442719099991586,1.0953573965284052e-16,0.44721359549995793,
    -0.27639320225002112,-0.85065080835203988,0.44721359549995793,
    0.89442719099991586,0,-0.44721359549995793,
    0.27639320225002106,0.85065080835203988,-0.44721359549995793,
    -0.72360679774997883,0.5257311121191337,-0.44721359549995793,
    -0.72360679774997894,-0.52573111211913348,-0.44721359549995793,
    0.27639320225002084,-0.85065080835203999,-0.44721359549995793,
    0,0,-1).finished();
  F = (DerivedF(20,3)<<
    0,1,2,
    0,2,3,
    0,3,4,
    0,4,5,
    0,5,1,
    1,6,2,
    2,7,3,
    3,8,4,
    4,9,5,
    5,10,1,
    6,7,2,
    7,8,3,
    8,9,4,
    9,10,5,
    10,6,1,
    6,11,7,
    7,11,8,
    8,11,9,
    9,11,10,
    10,11,6).finished();
}